

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

Gia_Man_t *
Gia_ManAreaBalance(Gia_Man_t *p,int fSimpleAnd,int nNewNodesMax,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Vec_Flt_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Gia_Man_t *pGVar9;
  Gia_Man_t *pGVar10;
  long lVar11;
  float fVar12;
  
  if (p->vCiArrs == (Vec_Int_t *)0x0) {
    pVVar2 = p->vInArrs;
    if (pVVar2 != (Vec_Flt_t *)0x0) {
      if (p->And2Delay == 0) {
        fVar12 = 1.0;
      }
      else {
        fVar12 = (float)p->And2Delay;
      }
      pVVar7 = p->vCis;
      if (0 < pVVar7->nSize) {
        piVar8 = pVVar7->pArray;
        lVar11 = 0;
        do {
          iVar6 = piVar8[lVar11];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_007087a2;
          if (iVar6 == 0) break;
          if (pVVar2->nSize <= lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          if (p->vLevels->nSize <= iVar6) goto LAB_007087c1;
          p->vLevels->pArray[iVar6] = (int)(pVVar2->pArray[lVar11] / fVar12);
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar7->nSize);
      }
    }
    goto LAB_0070863b;
  }
  iVar6 = p->And2Delay;
  pVVar7 = p->vLevels;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vLevels->pArray = (int *)0x0;
      pVVar7 = p->vLevels;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_007084b8;
    }
    free(pVVar7);
    p->vLevels = (Vec_Int_t *)0x0;
  }
LAB_007084b8:
  iVar1 = p->nObjs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar7->nCap = iVar5;
  if (iVar5 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar1;
LAB_00708545:
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar5 << 2);
    pVVar7->pArray = piVar8;
    pVVar7->nSize = iVar1;
    if (piVar8 == (int *)0x0) goto LAB_00708545;
    memset(piVar8,0,(long)iVar1 << 2);
  }
  p->vLevels = pVVar7;
  pVVar3 = p->vCis;
  if (0 < pVVar3->nSize) {
    piVar4 = pVVar3->pArray;
    lVar11 = 0;
    do {
      iVar1 = piVar4[lVar11];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_007087a2:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar1 == 0) break;
      if (p->vCiArrs->nSize <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pVVar7->nSize <= iVar1) {
LAB_007087c1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar8[iVar1] = p->vCiArrs->pArray[lVar11] / (int)(iVar6 + (uint)(iVar6 == 0));
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar3->nSize);
  }
LAB_0070863b:
  if ((p->pManTime != (void *)0x0) && (p->vLevels == (Vec_Int_t *)0x0)) {
    Gia_ManLevelWithBoxes(p);
  }
  pVVar7 = Gia_ManGetCiLevels(p);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    pGVar9 = Gia_ManDup(p);
  }
  else {
    pGVar9 = (Gia_Man_t *)Dsm_ManDeriveGia(p,0);
  }
  Gia_ManTransferTiming(pGVar9,p);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar9,(Gps_Par_t *)0x0);
  }
  if (fSimpleAnd == 0) {
    pGVar10 = Gia_ManDupMuxes(pGVar9,2);
  }
  else {
    pGVar10 = Gia_ManDup(pGVar9);
  }
  Gia_ManTransferTiming(pGVar10,pGVar9);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar10,(Gps_Par_t *)0x0);
  }
  if (pGVar9 != p) {
    Gia_ManStop(pGVar9);
  }
  pGVar9 = Dam_ManAreaBalanceInt(pGVar10,pVVar7,nNewNodesMax,fVerbose,fVeryVerbose);
  Gia_ManTransferTiming(pGVar9,pGVar10);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar9,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar10);
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
    }
    free(pVVar7);
  }
  pGVar10 = Gia_ManDupNoMuxes(pGVar9,0);
  Gia_ManTransferTiming(pGVar10,pGVar9);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar10,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar9);
  iVar6 = Gia_ManIsNormalized(pGVar10);
  pGVar9 = pGVar10;
  if (iVar6 == 0) {
    pGVar9 = Gia_ManDupNormalize(pGVar10,0);
    Gia_ManTransferTiming(pGVar9,pGVar10);
    Gia_ManStop(pGVar10);
  }
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManAreaBalance( Gia_Man_t * p, int fSimpleAnd, int nNewNodesMax, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew0, * pNew, * pNew1, * pNew2;
    Vec_Int_t * vCiLevels;
    // set arrival times for the input of the new AIG
    if ( p->vCiArrs )
    {
        int i, Id, And2Delay = p->And2Delay ? p->And2Delay : 1;
        Vec_IntFreeP( &p->vLevels );
        p->vLevels = Vec_IntStart( Gia_ManObjNum(p) );
        Gia_ManForEachCiId( p, Id, i )
            Vec_IntWriteEntry( p->vLevels, Id, Vec_IntEntry(p->vCiArrs, i)/And2Delay );
    }
    else if ( p->vInArrs )
    {
        int i, Id, And2Delay = p->And2Delay ? p->And2Delay : 1;
        Gia_ManForEachCiId( p, Id, i )
            Vec_IntWriteEntry( p->vLevels, Id, (int)(Vec_FltEntry(p->vInArrs, i)/And2Delay) );
    }
    // determine CI levels
    if ( p->pManTime && p->vLevels == NULL )
        Gia_ManLevelWithBoxes( p );
    vCiLevels = Gia_ManGetCiLevels( p );
    // get the starting manager
    pNew0 = Gia_ManHasMapping(p) ? (Gia_Man_t *)Dsm_ManDeriveGia(p, 0) : Gia_ManDup(p);
    Gia_ManTransferTiming( pNew0, p );
    if ( fVerbose )     Gia_ManPrintStats( pNew0, NULL );
    // derive internal manager
    pNew = fSimpleAnd ? Gia_ManDup( pNew0 ) : Gia_ManDupMuxes( pNew0, 2 );
    Gia_ManTransferTiming( pNew, pNew0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    if ( pNew0 != p ) Gia_ManStop( pNew0 );
    // perform the operation
    pNew1 = Dam_ManAreaBalanceInt( pNew, vCiLevels, nNewNodesMax, fVerbose, fVeryVerbose );
    Gia_ManTransferTiming( pNew1, pNew );
    if ( fVerbose )     Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    Vec_IntFreeP( &vCiLevels );
    // derive the final result
    pNew2 = Gia_ManDupNoMuxes( pNew1, 0 );
    Gia_ManTransferTiming( pNew2, pNew1 );
    if ( fVerbose )     Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    // normalize if needed
    if ( !Gia_ManIsNormalized(pNew2) )
    {
        pNew2 = Gia_ManDupNormalize( pNew1 = pNew2, 0 );
        Gia_ManTransferTiming( pNew2, pNew1 );
        Gia_ManStop( pNew1 );
    }
    //Gia_ManTransferTiming( pNew2, p );
    return pNew2;
}